

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cc
# Opt level: O3

int AMPLSLoadNLModel(AMPLS_MP_Solver *slv,char *nl_filename,char **options)

{
  long *plVar1;
  int iVar2;
  char *__s1;
  string filename_no_ext_;
  string nl_filename_;
  allocator<char> local_89;
  long *local_88;
  char local_80;
  long local_78 [2];
  long *local_68;
  long local_60;
  long local_58 [2];
  long *local_48 [2];
  long local_38 [2];
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,nl_filename,(allocator<char> *)&local_88);
  local_88 = local_78;
  std::__cxx11::string::_M_construct<char*>((string *)&local_88,local_68,local_60 + (long)local_68);
  __s1 = strrchr(nl_filename,0x2e);
  if (__s1 != (char *)0x0) {
    iVar2 = strcmp(__s1,".nl");
    if (iVar2 == 0) {
      std::__cxx11::string::resize((ulong)&local_88,local_80 + -3);
      goto LAB_0034616f;
    }
  }
  std::__cxx11::string::append((char *)&local_68);
LAB_0034616f:
  plVar1 = *slv->internal_info_;
  std::__cxx11::string::string<std::allocator<char>>((string *)local_48,nl_filename,&local_89);
  (**(code **)(*plVar1 + 0x80))(plVar1,local_48,&local_88,options);
  if (local_48[0] != local_38) {
    operator_delete(local_48[0],local_38[0] + 1);
  }
  (**(code **)(*plVar1 + 0x88))(plVar1);
  if (local_88 != local_78) {
    operator_delete(local_88,local_78[0] + 1);
  }
  if (local_68 != local_58) {
    operator_delete(local_68,local_58[0] + 1);
  }
  return 0;
}

Assistant:

int AMPLSLoadNLModel(AMPLS_MP_Solver* slv,
                     const char* nl_filename,
                     char** options) {
  return AMPLS__internal__TryCatchWrapper( slv, [=]() {
    std::string nl_filename_ = nl_filename;
    auto filename_no_ext_ = nl_filename_;
    const char *ext = std::strrchr(nl_filename, '.');
    if (!ext || std::strcmp(ext, ".nl") != 0)
      nl_filename_ += ".nl";
    else
      filename_no_ext_.resize(filename_no_ext_.size() - 3);

    auto be = AMPLSGetBackend(slv);
    be->ReadNL(nl_filename, filename_no_ext_, options);
    be->InputExtras();
  } );
}